

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.cpp
# Opt level: O3

void StringTools::split(string *str,char delimiter,
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *dest)

{
  istream *piVar1;
  string s;
  istringstream stream;
  value_type local_1c8;
  istringstream local_1a8 [120];
  ios_base local_130 [264];
  
  std::__cxx11::istringstream::istringstream(local_1a8,(string *)str,_S_in);
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a8,(string *)&local_1c8,delimiter);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(dest,&local_1c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  std::__cxx11::istringstream::~istringstream(local_1a8);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void split(const string& str, char delimiter, vector<string>& dest) {
    istringstream stream(str);
    string s;
    while (getline(stream, s, delimiter)) {
        dest.push_back(s);
    }
}